

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O1

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
TestChain100Setup::PopulateMempool
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *__return_storage_ptr__,TestChain100Setup *this,FastRandomContext *det_rand,
          size_t num_transactions,bool submit)

{
  pointer psVar1;
  element_type *peVar2;
  CTxMemPool *this_00;
  long lVar3;
  TestChain100Setup *pTVar4;
  CScript *pCVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  TestChain100Setup *pTVar9;
  uint64_t uVar10;
  CScript *pCVar11;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  _Elt_pointer ppVar12;
  ulong uVar13;
  uint uVar14;
  TestChain100Setup *this_01;
  CScript *__args_1;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  size_t n;
  pointer psVar19;
  long lVar20;
  _Head_base<0UL,_AddrMan_*,_false> _Var21;
  long in_FS_OFFSET;
  CTransactionRef ptx;
  CAmount amount_per_output;
  CMutableTransaction mtx;
  deque<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_> unspent_prevouts;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CScript spk;
  value_type local_228;
  ulong local_218;
  undefined1 local_210 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_1f8;
  undefined1 local_1d8 [88];
  undefined1 local_180;
  unique_lock<std::recursive_mutex> local_178;
  undefined1 local_168 [24];
  _Head_base<0UL,_ECC_Context_*,_false> _Stack_150;
  uint32_t local_148;
  _Base_ptr local_140;
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_128 [4];
  undefined1 local_58 [28];
  uint uStack_3c;
  size_type local_38;
  
  local_38 = *(size_type *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8._64_8_ = (__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>)0x0;
  local_1d8._72_8_ =
       (__uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>)0x0;
  local_1d8._48_8_ = (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)0x0;
  local_1d8._56_8_ = (__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>)0x0;
  local_1d8._32_8_ = (_Elt_pointer)0x0;
  local_1d8._40_8_ = (SignalInterrupt *)0x0;
  local_1d8._16_8_ = (__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>)0x0;
  local_1d8._24_8_ = (__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>)0x0;
  local_1d8._0_8_ = (_Map_pointer)0x0;
  local_1d8._8_8_ = 0;
  std::_Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::
  _M_initialize_map((_Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                     *)local_1d8,0);
  psVar19 = (this->m_coinbase_txns).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = this;
  if (psVar19 != psVar1) {
    this_01 = (TestChain100Setup *)local_1d8;
    do {
      peVar2 = (psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_168._0_8_ =
           *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_168._8_8_ =
           *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
      ;
      local_168._16_8_ =
           *(undefined8 *)
            ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      _Stack_150._M_head_impl =
           *(ECC_Context **)
            ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      local_148 = 0;
      local_140 = (_Base_ptr)
                  ((peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start)->nValue;
      std::deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>>::
      emplace_back<std::pair<COutPoint,long>>
                ((deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>> *)
                 this_01,(pair<COutPoint,_long> *)local_168);
      psVar19 = psVar19 + 1;
    } while (psVar19 != psVar1);
  }
  if (num_transactions != 0) {
    do {
      if (local_1d8._48_8_ == local_1d8._16_8_) break;
      CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_210);
      do {
        pTVar9 = (TestChain100Setup *)
                 RandomMixin<FastRandomContext>::randbits
                           (&det_rand->super_RandomMixin<FastRandomContext>,5);
        pTVar4 = this_01;
        if ((TestChain100Setup *)0x17 >= pTVar9) {
          pTVar4 = pTVar9;
        }
        this_01 = (TestChain100Setup *)((ulong)pTVar4 & 0xffffffff);
      } while ((TestChain100Setup *)0x17 < pTVar9);
      uVar14 = (int)pTVar4 + 1;
      __args_1 = (CScript *)(ulong)uVar14;
      if (uVar14 == 0) {
        uVar17 = 0;
        uVar16 = uVar17;
      }
      else {
        lVar18 = (long)(int)uVar14;
        uVar17 = 0;
        __args_1 = (CScript *)local_168;
        do {
          uVar6 = local_1d8._16_8_;
          uVar16 = uVar17;
          if (local_1d8._48_8_ == local_1d8._16_8_) break;
          local_168._16_8_ = (pointer)0x0;
          _Stack_150._M_head_impl = (ECC_Context *)0x0;
          local_168._0_8_ = (ArgsManager *)0x0;
          local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint_const&,CScript>
                    ((vector<CTxIn,std::allocator<CTxIn>> *)local_210,(COutPoint *)local_1d8._16_8_,
                     __args_1);
          if (0x1c < _Stack_150._M_head_impl._4_4_) {
            free((void *)local_168._0_8_);
            local_168._0_8_ = (ArgsManager *)0x0;
          }
          uVar17 = uVar17 + *(long *)(uVar6 + 0x28);
          if ((_Elt_pointer)local_1d8._16_8_ == (_Elt_pointer)(local_1d8._32_8_ + -0x30)) {
            operator_delete((void *)local_1d8._24_8_,0x1e0);
            local_1d8._16_8_ = *(undefined8 *)(local_1d8._40_8_ + 8);
            local_1d8._32_8_ = local_1d8._16_8_ + 0x1e0;
            local_1d8._24_8_ = local_1d8._16_8_;
            local_1d8._40_8_ = (TokenPipeEnd *)(local_1d8._40_8_ + 8);
          }
          else {
            local_1d8._16_8_ = local_1d8._16_8_ + 0x30;
          }
          lVar18 = lVar18 + -1;
          uVar16 = uVar17;
        } while (lVar18 != 0);
      }
      do {
        uVar10 = RandomMixin<FastRandomContext>::randbits
                           (&det_rand->super_RandomMixin<FastRandomContext>,5);
        uVar15 = uVar17;
        if (0x17 >= uVar10) {
          uVar15 = uVar10;
        }
        uVar17 = uVar15 & 0xffffffff;
      } while (0x17 < uVar10);
      do {
        pCVar11 = (CScript *)
                  RandomMixin<FastRandomContext>::randbits
                            (&det_rand->super_RandomMixin<FastRandomContext>,5);
        pCVar5 = __args_1;
        if ((CScript *)0x1d >= pCVar11) {
          pCVar5 = pCVar11;
        }
        __args_1 = (CScript *)((ulong)pCVar5 & 0xffffffff);
      } while ((CScript *)0x1d < pCVar11);
      uVar17 = (ulong)((int)uVar15 + 1);
      local_218 = (uVar16 - (long)((int)pCVar5 * 100)) / uVar17;
      lVar18 = uVar17 + (uVar17 == 0);
      lVar20 = 0;
      do {
        local_58._16_4_ = 0;
        local_58._20_4_ = 0;
        stack0xffffffffffffffc0 = (pointer)0x0;
        local_58._0_4_ = 0;
        local_58[4] = 0;
        local_58[5] = 0;
        local_58[6] = 0;
        local_58[7] = 0;
        local_58._8_4_ = 0;
        local_58[0xc] = 0;
        local_58[0xd] = 0;
        local_58[0xe] = 0;
        local_58[0xf] = 0;
        local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(lVar20 + num_transactions);
        other = &CScript::operator<<((CScript *)local_58,(CScriptNum *)&local_228)->
                 super_CScriptBase;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,other);
        if (0x1c < uStack_3c) {
          free((void *)CONCAT44(local_58._4_4_,local_58._0_4_));
          local_58._0_4_ = 0;
          local_58[4] = 0;
          local_58[5] = 0;
          local_58[6] = 0;
          local_58[7] = 0;
        }
        std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript&>
                  ((vector<CTxOut,std::allocator<CTxOut>> *)&local_1f8,(long *)&local_218,
                   (CScript *)local_168);
        if (0x1c < _Stack_150._M_head_impl._4_4_) {
          free((void *)local_168._0_8_);
          local_168._0_8_ = (ArgsManager *)0x0;
        }
        lVar20 = lVar20 + 1;
      } while (lVar18 != lVar20);
      local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
                (&local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(CTransaction **)&local_228,(allocator<CTransaction> *)local_168,
                 (CMutableTransaction *)local_210);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::push_back(__return_storage_ptr__,&local_228);
      if (3000 < (long)local_218) {
        lVar20 = 0;
        do {
          local_168._0_8_ =
               *(undefined8 *)
                ((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          local_168._8_8_ =
               *(undefined8 *)
                (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          local_168._16_8_ =
               *(undefined8 *)
                (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          _Stack_150._M_head_impl =
               *(ECC_Context **)
                (((local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          local_148 = (uint32_t)lVar20;
          std::deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>>::
          emplace_back<COutPoint,long_const&>
                    ((deque<std::pair<COutPoint,long>,std::allocator<std::pair<COutPoint,long>>> *)
                     local_1d8,(COutPoint *)local_168,(long *)&local_218);
          _Var21._M_head_impl = (AddrMan *)local_1d8._48_8_;
          if (local_1d8._48_8_ - local_1d8._56_8_ == 0) {
            _Var21._M_head_impl =
                 (AddrMan *)
                 ((((NetGroupManager *)(local_1d8._72_8_ + -0x28))->m_asmap).
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage + 0x3c);
          }
          uVar15 = (((long)(local_1d8._32_8_ - local_1d8._16_8_) >> 4) * -0x5555555555555555 +
                   ((long)(local_1d8._48_8_ - local_1d8._56_8_) >> 4) * -0x5555555555555555 +
                   (((long)(local_1d8._72_8_ - local_1d8._40_8_) >> 3) + -1 +
                   (ulong)((_Head_base<0UL,_const_NetGroupManager_*,_false>)local_1d8._72_8_ ==
                          (_Head_base<0UL,_const_NetGroupManager_*,_false>)0x0)) * 10) - 1;
          if (uVar15 == 0) {
            uVar14 = 0x40;
          }
          else {
            lVar3 = 0x3f;
            if (uVar15 != 0) {
              for (; uVar15 >> lVar3 == 0; lVar3 = lVar3 + -1) {
              }
            }
            uVar14 = (uint)lVar3 ^ 0x3f;
          }
          do {
            uVar10 = RandomMixin<FastRandomContext>::randbits
                               (&det_rand->super_RandomMixin<FastRandomContext>,0x40 - uVar14);
          } while (uVar15 < uVar10);
          uVar15 = ((long)(local_1d8._16_8_ - local_1d8._24_8_) >> 4) * -0x5555555555555555 + uVar10
          ;
          if (uVar15 < 10) {
            ppVar12 = (_Elt_pointer)(local_1d8._16_8_ + uVar10 * 0x30);
          }
          else {
            if ((long)uVar15 < 1) {
              uVar13 = ~(~uVar15 / 10);
            }
            else {
              uVar13 = uVar15 / 10;
            }
            ppVar12 = (_Elt_pointer)
                      (*(long *)((atomic<bool> *)local_1d8._40_8_ + uVar13 * 8) +
                      (uVar13 * -10 + uVar15) * 0x30);
          }
          local_148 = *(uint32_t *)((long)_Var21._M_head_impl + -0x10);
          local_168._0_8_ =
               *(undefined8 *)
                (((_Elt_pointer)((long)_Var21._M_head_impl + -0x30))->first).hash.m_wrapped.
                super_base_blob<256U>.m_data._M_elems;
          local_168._8_8_ = *(undefined8 *)((long)_Var21._M_head_impl + -0x28);
          local_168._16_8_ = *(undefined8 *)((long)_Var21._M_head_impl + -0x20);
          _Stack_150._M_head_impl = *(ECC_Context **)((long)_Var21._M_head_impl + -0x18);
          *(uint32_t *)((long)_Var21._M_head_impl + -0x10) = (ppVar12->first).n;
          uVar6 = *(undefined8 *)
                   (ppVar12->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uVar7 = *(undefined8 *)
                   ((ppVar12->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          uVar8 = *(undefined8 *)
                   ((ppVar12->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          *(undefined8 *)((long)_Var21._M_head_impl + -0x20) =
               *(undefined8 *)
                ((ppVar12->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          *(undefined8 *)((long)_Var21._M_head_impl + -0x18) = uVar8;
          *(undefined8 *)
           (((_Elt_pointer)((long)_Var21._M_head_impl + -0x30))->first).hash.m_wrapped.
           super_base_blob<256U>.m_data._M_elems = uVar6;
          *(undefined8 *)((long)_Var21._M_head_impl + -0x28) = uVar7;
          (ppVar12->first).n = local_148;
          *(undefined8 *)
           ((ppVar12->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
               local_168._16_8_;
          *(ECC_Context **)
           ((ppVar12->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
               _Stack_150._M_head_impl;
          *(undefined8 *)(ppVar12->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
               local_168._0_8_;
          *(undefined8 *)((ppVar12->first).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
               = local_168._8_8_;
          lVar3 = *(long *)((long)_Var21._M_head_impl + -8);
          *(long *)((long)_Var21._M_head_impl + -8) = ppVar12->second;
          ppVar12->second = lVar3;
          lVar20 = lVar20 + 1;
        } while (lVar20 != lVar18);
      }
      if (submit) {
        local_178._M_device = &cs_main.super_recursive_mutex;
        local_178._M_owns = false;
        std::unique_lock<std::recursive_mutex>::lock(&local_178);
        local_1d8._80_8_ =
             &((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
               mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
               .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs;
        local_180 = 0;
        std::unique_lock<std::recursive_mutex>::lock
                  ((unique_lock<std::recursive_mutex> *)(local_1d8 + 0x50));
        local_58[4] = 0;
        local_58[5] = 0;
        local_58[6] = 0;
        local_58[7] = 0;
        local_58._8_4_ = 0;
        local_58[0xc] = 0;
        local_58[0xd] = 0;
        local_58[0xe] = 0;
        local_58[0xf] = 0;
        local_58._16_4_ = 0;
        this_00 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                  mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
                  _M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
        CTxMemPoolEntry::CTxMemPoolEntry
                  ((CTxMemPoolEntry *)local_168,&local_228,uVar16 - uVar17 * local_218,0,1,0,false,4
                   ,(LockPoints)(ZEXT424((uint)local_58._0_4_) << 0x20));
        CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
        std::
        _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
        ::~_Rb_tree(local_128);
        std::
        _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
        ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                     *)(local_168 + 0x10));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)(local_1d8 + 0x50));
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_178);
      }
      this_01 = (TestChain100Setup *)local_168;
      if (local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      num_transactions = num_transactions - 1;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_1f8);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_210);
    } while (num_transactions != 0);
  }
  std::_Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>::
  ~_Deque_base((_Deque_base<std::pair<COutPoint,_long>,_std::allocator<std::pair<COutPoint,_long>_>_>
                *)local_1d8);
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CTransactionRef> TestChain100Setup::PopulateMempool(FastRandomContext& det_rand, size_t num_transactions, bool submit)
{
    std::vector<CTransactionRef> mempool_transactions;
    std::deque<std::pair<COutPoint, CAmount>> unspent_prevouts;
    std::transform(m_coinbase_txns.begin(), m_coinbase_txns.end(), std::back_inserter(unspent_prevouts),
        [](const auto& tx){ return std::make_pair(COutPoint(tx->GetHash(), 0), tx->vout[0].nValue); });
    while (num_transactions > 0 && !unspent_prevouts.empty()) {
        // The number of inputs and outputs are random, between 1 and 24.
        CMutableTransaction mtx = CMutableTransaction();
        const size_t num_inputs = det_rand.randrange(24) + 1;
        CAmount total_in{0};
        for (size_t n{0}; n < num_inputs; ++n) {
            if (unspent_prevouts.empty()) break;
            const auto& [prevout, amount] = unspent_prevouts.front();
            mtx.vin.emplace_back(prevout, CScript());
            total_in += amount;
            unspent_prevouts.pop_front();
        }
        const size_t num_outputs = det_rand.randrange(24) + 1;
        const CAmount fee = 100 * det_rand.randrange(30);
        const CAmount amount_per_output = (total_in - fee) / num_outputs;
        for (size_t n{0}; n < num_outputs; ++n) {
            CScript spk = CScript() << CScriptNum(num_transactions + n);
            mtx.vout.emplace_back(amount_per_output, spk);
        }
        CTransactionRef ptx = MakeTransactionRef(mtx);
        mempool_transactions.push_back(ptx);
        if (amount_per_output > 3000) {
            // If the value is high enough to fund another transaction + fees, keep track of it so
            // it can be used to build a more complex transaction graph. Insert randomly into
            // unspent_prevouts for extra randomness in the resulting structures.
            for (size_t n{0}; n < num_outputs; ++n) {
                unspent_prevouts.emplace_back(COutPoint(ptx->GetHash(), n), amount_per_output);
                std::swap(unspent_prevouts.back(), unspent_prevouts[det_rand.randrange(unspent_prevouts.size())]);
            }
        }
        if (submit) {
            LOCK2(cs_main, m_node.mempool->cs);
            LockPoints lp;
            m_node.mempool->addUnchecked(CTxMemPoolEntry(ptx, /*fee=*/(total_in - num_outputs * amount_per_output),
                                                         /*time=*/0, /*entry_height=*/1, /*entry_sequence=*/0,
                                                         /*spends_coinbase=*/false, /*sigops_cost=*/4, lp));
        }
        --num_transactions;
    }
    return mempool_transactions;
}